

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Item.cpp
# Opt level: O0

void __thiscall Item::Item(Item *this,int grid_width,int grid_height)

{
  int grid_height_local;
  int grid_width_local;
  Item *this_local;
  
  GameObject::GameObject(&this->super_GameObject,ObjectItem,grid_width,grid_height,-1,-1);
  (this->super_GameObject)._vptr_GameObject = (_func_int **)&PTR_ResetPosition_0010cd78;
  (this->super_GameObject).field_0x24 = 0;
  (**(this->super_GameObject)._vptr_GameObject)();
  (this->super_GameObject).speed = 0.0;
  return;
}

Assistant:

Item::Item(int grid_width, int grid_height) : GameObject(ObjectType::ObjectItem, grid_width,  grid_height, -1, -1)
 {  
  ResetPosition();
  
  speed =0.f;
 }